

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void lodepng::mulMatrixMatrix(float *result,float *a,float *b)

{
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  float temp [9];
  int i;
  float afStack_48 [11];
  int local_1c;
  float *local_18;
  float *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  mulMatrix(afStack_48,afStack_48 + 3,afStack_48 + 6,in_RSI,(double)*in_RDX,(double)in_RDX[3],
            (double)in_RDX[6]);
  mulMatrix(afStack_48 + 1,afStack_48 + 4,afStack_48 + 7,local_10,(double)local_18[1],
            (double)local_18[4],(double)local_18[7]);
  mulMatrix(afStack_48 + 2,afStack_48 + 5,afStack_48 + 8,local_10,(double)local_18[2],
            (double)local_18[5],(double)local_18[8]);
  for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
    *(float *)(local_8 + (long)local_1c * 4) = afStack_48[local_1c];
  }
  return;
}

Assistant:

static void mulMatrixMatrix(float* result, const float* a, const float* b) {
  int i;
  float temp[9]; /* temp is to allow result and a or b to be the same */
  mulMatrix(&temp[0], &temp[3], &temp[6], a, b[0], b[3], b[6]);
  mulMatrix(&temp[1], &temp[4], &temp[7], a, b[1], b[4], b[7]);
  mulMatrix(&temp[2], &temp[5], &temp[8], a, b[2], b[5], b[8]);
  for(i = 0; i < 9; i++) result[i] = temp[i];
}